

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> * __thiscall
bhf::ads::RegistryAccess::Enumerate
          (vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
           *__return_storage_ptr__,RegistryAccess *this,RegistryEntry *key,uint32_t regFlag,
          size_t bufferSize)

{
  nRegHive indexGroup;
  size_t writeLength;
  bool bVar1;
  uchar *readData;
  uchar *writeData;
  AdsException *this_00;
  runtime_error *this_01;
  RegistryEntry local_b8;
  int local_7c;
  long local_78;
  long ret;
  allocator<unsigned_char> local_59;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint local_38;
  uint32_t bytesRead;
  uint32_t offset;
  size_t bufferSize_local;
  uint32_t regFlag_local;
  RegistryEntry *key_local;
  RegistryAccess *this_local;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *entries;
  
  bVar1 = false;
  std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::vector
            (__return_storage_ptr__);
  local_38 = regFlag;
  while( true ) {
    if ((local_38 & 0xc0000000) != regFlag) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"overflow in offset detected");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::allocator<unsigned_char>::allocator(&local_59);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,bufferSize,
               &local_59);
    std::allocator<unsigned_char>::~allocator(&local_59);
    indexGroup = key->hive;
    readData = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    writeLength = key->keyLen;
    writeData = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&key->buffer);
    local_78 = AdsDevice::ReadWriteReqEx2
                         (&this->device,indexGroup,local_38,bufferSize,readData,writeLength,
                          writeData,
                          (uint32_t *)
                          ((long)&data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    if (local_78 == 0x70c) {
      bVar1 = true;
      local_7c = 1;
    }
    else {
      if (local_78 != 0) {
        this_00 = (AdsException *)__cxa_allocate_exception(0x30);
        AdsException::AdsException(this_00,local_78);
        __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                 (ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      RegistryEntry::Create
                (&local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                 key->hive,regFlag);
      std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::push_back
                (__return_storage_ptr__,&local_b8);
      RegistryEntry::~RegistryEntry(&local_b8);
      local_7c = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    if (local_7c != 0) break;
    local_38 = local_38 + 1;
  }
  if (!bVar1) {
    std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RegistryEntry> RegistryAccess::Enumerate(const RegistryEntry& key, const uint32_t regFlag,
                                                     const size_t bufferSize) const
{
    std::vector<RegistryEntry> entries;
    for (auto offset = regFlag; (offset & REGFLAG_ENUMVALUE_MASK) == regFlag; ++offset) {
        uint32_t bytesRead = 0;
        std::vector<uint8_t> data(bufferSize);
        const auto ret = device.ReadWriteReqEx2(key.hive,
                                                offset,
                                                bufferSize,
                                                data.data(),
                                                key.keyLen,
                                                key.buffer.data(),
                                                &bytesRead);
        if (ret == ADSERR_DEVICE_NOTFOUND) {
            // ADS_ERR_DEVICE_NOTFOUND is returned once the enumeration is exhausted.
            return entries;
        } else if (ret) {
            throw AdsException(ret);
        }
        data.resize(bytesRead);
        entries.push_back(RegistryEntry::Create(std::move(data), key.hive, regFlag));
    }
    throw std::runtime_error("overflow in offset detected");
}